

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

void Vec_IntPushOrder(Vec_Int_t *p,int Entry)

{
  uint uVar1;
  bool bVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  
  uVar1 = p->nSize;
  uVar5 = (ulong)uVar1;
  if (uVar1 == p->nCap) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(0x40);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,0x40);
      }
      p->pArray = piVar3;
      iVar4 = 0x10;
      if (piVar3 == (int *)0x0) {
LAB_003b1634:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
    }
    else {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(uVar5 * 8);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,uVar5 * 8);
      }
      p->pArray = piVar3;
      if (piVar3 == (int *)0x0) goto LAB_003b1634;
      iVar4 = uVar1 * 2;
    }
    p->nCap = iVar4;
    uVar5 = (ulong)(uint)p->nSize;
  }
  p->nSize = (int)uVar5 + 1;
  piVar3 = p->pArray;
  if (0 < (int)uVar5) {
    do {
      if (piVar3[uVar5 - 1] <= Entry) goto LAB_003b1628;
      piVar3[uVar5] = piVar3[uVar5 - 1];
      bVar2 = 1 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar2);
    uVar5 = 0;
  }
LAB_003b1628:
  piVar3[(int)uVar5] = Entry;
  return;
}

Assistant:

static inline void Vec_IntPushOrder( Vec_Int_t * p, int Entry )
{
    int i;
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_IntGrow( p, 16 );
        else
            Vec_IntGrow( p, 2 * p->nCap );
    }
    p->nSize++;
    for ( i = p->nSize-2; i >= 0; i-- )
        if ( p->pArray[i] > Entry )
            p->pArray[i+1] = p->pArray[i];
        else
            break;
    p->pArray[i+1] = Entry;
}